

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

void cargo_set_errorv(cargo_t ctx,cargo_err_flags_t flags,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  char *error;
  char *error2;
  char *local_20;
  char *local_18;
  
  local_20 = (char *)0x0;
  local_18 = (char *)0x0;
  if (ctx != (cargo_t)0x0) {
    iVar1 = cargo_vasprintf(&local_20,fmt,ap);
    if (-1 < iVar1) {
      if ((flags & CARGO_ERR_APPEND) != CARGO_ERR_DEFAULT && ctx->error != (char *)0x0) {
        iVar1 = cargo_asprintf(&local_18,"%s%s",ctx->error,local_20);
        if (-1 < iVar1) {
          _cargo_free(local_20);
          local_20 = local_18;
        }
      }
      _cargo_xfree(&ctx->error);
      ctx->error = local_20;
    }
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x14d6,
                "void cargo_set_errorv(cargo_t, cargo_err_flags_t, const char *, struct __va_list_tag *)"
               );
}

Assistant:

void cargo_set_errorv(cargo_t ctx, cargo_err_flags_t flags,
                    const char *fmt, va_list ap)
{
    int ret = 0;
    char *error = NULL;
    char *error2 = NULL;
    assert(ctx);

    ret = cargo_vasprintf(&error, fmt, ap);

    if (ret >= 0)
    {
        // Maybe this can be done a bit nicer...
        if (ctx->error && (flags & CARGO_ERR_APPEND))
        {
            ret = cargo_asprintf(&error2, "%s%s", ctx->error, error);

            if (ret >= 0)
            {
                _cargo_free(error);
                error = error2;
            }
        }

        _cargo_xfree(&ctx->error);
        ctx->error = error;
    }
}